

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall lest::transformed_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  byte bVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  
  bVar1 = (byte)this;
  lVar2 = 8;
  do {
    if (*(byte *)((long)&PTR_what_001b9c88 + lVar2) == bVar1) {
      std::__cxx11::string::string
                ((string *)&local_58,*(char **)(&DAT_001b9c90 + lVar2),(allocator *)&local_38);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_58,local_58->_M_local_buf + local_50);
      paVar3 = &local_48;
      goto LAB_0015dce6;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x58);
  if (bVar1 < 0x20) {
    to_hex_string_abi_cxx11_(&local_38,(lest *)(ulong)(uint)(int)(char)bVar1,chr);
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_38._M_dataplus._M_p,
               local_38._M_dataplus._M_p + local_38._M_string_length);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_38,'\x01');
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_38._M_dataplus._M_p,
               local_38._M_dataplus._M_p + local_38._M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_58,local_58->_M_local_buf + local_50);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  paVar3 = &local_38.field_2;
LAB_0015dce6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}